

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void msa_sld_df(uint32_t df,wr_t *pwd,wr_t *pws,target_ulong rt)

{
  uint local_80;
  uint local_7c;
  uint32_t k;
  uint32_t i;
  uint8_t v [64];
  uint uStack_28;
  uint32_t n;
  target_ulong rt_local;
  wr_t *pws_local;
  wr_t *pwd_local;
  uint32_t df_local;
  
  uStack_28 = (uint)rt;
  pwd_local._4_1_ = (char)df;
  uStack_28 = uStack_28 & (int)(0x80L >> (pwd_local._4_1_ + 3U & 0x3f)) - 1U;
  switch(df) {
  case 0:
    for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
      *(int8_t *)((long)&k + (ulong)local_7c) = pws->b[local_7c];
      v[(ulong)local_7c + 8] = pwd->b[local_7c];
    }
    for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
      pwd->b[local_7c] = *(int8_t *)((long)&k + (ulong)(local_7c + uStack_28));
    }
    break;
  case 1:
    for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
      for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
        *(int8_t *)((long)&k + (ulong)local_7c) = pws->b[(ulong)local_80 * 8 + (ulong)local_7c];
        v[local_7c] = pwd->b[(ulong)local_80 * 8 + (ulong)local_7c];
      }
      for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
        pwd->b[(ulong)local_80 * 8 + (ulong)local_7c] =
             *(int8_t *)((long)&k + (ulong)(local_7c + uStack_28));
      }
    }
    break;
  case 2:
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        *(int8_t *)((long)&k + (ulong)local_7c) = pws->b[(ulong)local_80 * 4 + (ulong)local_7c];
        v[(ulong)local_7c - 4] = pwd->b[(ulong)local_80 * 4 + (ulong)local_7c];
      }
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        pwd->b[(ulong)local_80 * 4 + (ulong)local_7c] =
             *(int8_t *)((long)&k + (ulong)(local_7c + uStack_28));
      }
    }
    break;
  case 3:
    for (local_80 = 0; local_80 < 8; local_80 = local_80 + 1) {
      for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
        *(int8_t *)((long)&k + (ulong)local_7c) = pws->b[(ulong)local_80 * 2 + (ulong)local_7c];
        *(int8_t *)((long)&k + (ulong)local_7c + 2) = pwd->b[(ulong)local_80 * 2 + (ulong)local_7c];
      }
      for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
        pwd->b[(ulong)local_80 * 2 + (ulong)local_7c] =
             *(int8_t *)((long)&k + (ulong)(local_7c + uStack_28));
      }
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1276,"void msa_sld_df(uint32_t, wr_t *, wr_t *, target_ulong)");
  }
  return;
}

Assistant:

static inline void msa_sld_df(uint32_t df, wr_t *pwd,
                              wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint8_t v[64];
    uint32_t i, k;

    switch (df) {
    case DF_BYTE:
        CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_BYTE), 0);
        break;
    case DF_HALF:
        for (k = 0; k < 2; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_HALF), k);
        }
        break;
    case DF_WORD:
        for (k = 0; k < 4; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_WORD), k);
        }
        break;
    case DF_DOUBLE:
        for (k = 0; k < 8; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_DOUBLE), k);
        }
        break;
    default:
        assert(0);
    }
}